

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

uc_afl_ret
uc_afl_fuzz_custom(uc_engine *uc,char *input_file,uc_afl_cb_place_input_t place_input_callback,
                  uc_afl_fuzz_cb_t fuzz_callbck,uc_afl_cb_validate_crash_t validate_crash_callback,
                  bool always_validate,uint32_t persistent_iters,void *data)

{
  double __x;
  undefined1 local_f0 [8];
  UCAFL ucafl;
  bool always_validate_local;
  uc_afl_cb_validate_crash_t validate_crash_callback_local;
  uc_afl_fuzz_cb_t fuzz_callbck_local;
  uc_afl_cb_place_input_t place_input_callback_local;
  char *input_file_local;
  uc_engine *uc_local;
  
  ucafl.h4_._7_1_ = always_validate;
  log_init();
  if (uc == (uc_engine *)0x0) {
    log(__x);
    uc_local._4_4_ = UC_AFL_RET_ERROR;
  }
  else if ((input_file == (char *)0x0) || (*input_file == '\0')) {
    log(__x);
    uc_local._4_4_ = UC_AFL_RET_ERROR;
  }
  else if (place_input_callback == (uc_afl_cb_place_input_t)0x0) {
    log(__x);
    uc_local._4_4_ = UC_AFL_RET_ERROR;
  }
  else if (((ucafl.h4_._7_1_ & 1) == 0) ||
          (validate_crash_callback != (uc_afl_cb_validate_crash_t)0x0)) {
    if (fuzz_callbck == (uc_afl_fuzz_cb_t)0x0) {
      log(__x);
      uc_local._4_4_ = UC_AFL_RET_ERROR;
    }
    else {
      UCAFL::UCAFL((UCAFL *)local_f0,uc,input_file,place_input_callback,validate_crash_callback,
                   fuzz_callbck,(bool)(ucafl.h4_._7_1_ & 1),persistent_iters,data);
      uc_local._4_4_ = UCAFL::fsrv_run((UCAFL *)local_f0);
      UCAFL::~UCAFL((UCAFL *)local_f0);
    }
  }
  else {
    log(__x);
    uc_local._4_4_ = UC_AFL_RET_ERROR;
  }
  return uc_local._4_4_;
}

Assistant:

UNICORNAFL_EXPORT uc_afl_ret uc_afl_fuzz_custom(
    uc_engine* uc, char* input_file,
    uc_afl_cb_place_input_t place_input_callback, uc_afl_fuzz_cb_t fuzz_callbck,
    uc_afl_cb_validate_crash_t validate_crash_callback, bool always_validate,
    uint32_t persistent_iters, void* data) {

    log_init();

    if (!uc) {
        ERR("Unicorn Engine passed to uc_afl_fuzz is NULL!\n");
        return UC_AFL_RET_ERROR;
    }
    if (!input_file || input_file[0] == 0) {
        ERR("No input file provided to uc_afl_fuzz.\n");
        return UC_AFL_RET_ERROR;
    }
    if (!place_input_callback) {
        ERR("no place_input_callback set.\n");
        return UC_AFL_RET_ERROR;
    }
    if (always_validate && !validate_crash_callback) {
        ERR("always_validate set but validate_crash_callback is missing.\n");
        return UC_AFL_RET_ERROR;
    }
    if (!fuzz_callbck) {
        ERR("No fuzz_callback set.\n");
        return UC_AFL_RET_ERROR;
    }

    UCAFL ucafl(uc, input_file, place_input_callback, validate_crash_callback,
                fuzz_callbck, always_validate, persistent_iters, data);

    return ucafl.fsrv_run();
}